

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress.c
# Opt level: O0

Status uncompress(Header *header,FILE *ifp,FILE *ofp,CompType type)

{
  code_int cVar1;
  byte bVar2;
  Ferror FVar3;
  Byte byte;
  char *local_50;
  char *message;
  code_int incode;
  code_int oldcode;
  code_int code;
  code_int finchar;
  char_type *stackp;
  CompType type_local;
  FILE *ofp_local;
  FILE *ifp_local;
  Header *header_local;
  
  init_garble();
  crc = 0;
  clear_flg = 0;
  offset = 0;
  size = 0;
  readsize = (long)header->complen;
  if (type == SQUASH) {
    maxbits = 0xd;
  }
  else if (type == UNIX_COMPRESS) {
    read_byte(ifp);
    read_byte(ifp);
    bVar2 = read_byte(ifp);
    maxbits = bVar2 & 0x1f;
    readsize = readsize + -3;
  }
  else if (arcfs == 0) {
    bVar2 = read_byte(ifp);
    maxbits = (int)bVar2;
    readsize = readsize + -1;
  }
  else {
    maxbits = arcfs_maxbits;
    ungarble('\0');
  }
  maxmaxcode = (1 << ((byte)maxbits & 0x1f)) + -1;
  n_bits = 9;
  maxcode = 0x1ff;
  for (incode = 0xff; -1 < incode; incode = incode + -1) {
    codetab[incode] = 0;
    *(char *)((long)htab + (long)incode) = (char)incode;
  }
  free_ent = 0x101;
  message._4_4_ = getcode(ifp);
  if (message._4_4_ != -1) {
    byte = (Byte)message._4_4_;
    if (type == CRUNCH) {
      putc_init();
      putc_ncr(ofp,byte);
    }
    else {
      if (testing == '\0') {
        write_byte(ofp,byte);
      }
      calccrc(byte);
    }
    _code = (byte *)(htab + 0x4000);
    oldcode = message._4_4_;
    while ((incode = getcode(ifp), incode != -1 && (FVar3 = check_stream(ifp), FVar3 == FNOERR))) {
      if (incode == 0x100) {
        for (incode = 0xff; -1 < incode; incode = incode + -1) {
          codetab[incode] = 0;
        }
        clear_flg = 1;
        free_ent = 0x100;
        incode = getcode(ifp);
        if (incode == -1) break;
      }
      cVar1 = incode;
      if (free_ent <= incode) {
        *_code = (byte)oldcode;
        incode = message._4_4_;
        _code = _code + 1;
      }
      for (; 0xff < incode; incode = (code_int)codetab[incode]) {
        if (&free_ent < _code + 1) {
          error("%s: uncompress: corrupt or garbled archive file",ourname);
          exit(1);
        }
        *_code = *(byte *)((long)htab + (long)incode);
        _code = _code + 1;
      }
      if (&free_ent < _code + 1) {
        error("%s: uncompress: corrupt or garbled archive file",ourname);
        exit(1);
      }
      bVar2 = *(byte *)((long)htab + (long)incode);
      oldcode = (code_int)bVar2;
      *_code = bVar2;
      _code = _code + 1;
      while (htab + 0x4000 < _code) {
        _code = _code + -1;
        if (type == CRUNCH) {
          putc_ncr(ofp,*_code);
        }
        else {
          if (testing == '\0') {
            write_byte(ofp,*_code);
          }
          calccrc(*_code);
        }
      }
      if (free_ent < maxmaxcode) {
        codetab[free_ent] = (unsigned_short)message._4_4_;
        *(byte *)((long)htab + (long)free_ent) = bVar2;
        free_ent = free_ent + 1;
      }
      message._4_4_ = cVar1;
    }
  }
  FVar3 = check_stream(ifp);
  if (FVar3 == FRWERR) {
    header_local._4_4_ = RERR;
  }
  else if ((testing == '\0') && (FVar3 = check_stream(ofp), FVar3 == FRWERR)) {
    header_local._4_4_ = WERR;
  }
  else if ((crc & 0xffff) == (uint)header->crc) {
    if (testing == '\0') {
      switch(type) {
      case COMPRESS:
      case UNIX_COMPRESS:
        local_50 = "uncompressed";
        break;
      case SQUASH:
        local_50 = "unsquashed";
        break;
      case CRUNCH:
        local_50 = "uncrunched";
        break;
      default:
        local_50 = "internal error";
      }
    }
    else {
      switch(type) {
      case COMPRESS:
      case UNIX_COMPRESS:
        local_50 = "OK (compressed)";
        break;
      case SQUASH:
        local_50 = "OK (squashed)";
        break;
      case CRUNCH:
        local_50 = "OK (crunched)";
        break;
      default:
        local_50 = "internal error";
      }
    }
    if (quiet == '\0') {
      msg("%s",local_50);
    }
    header_local._4_4_ = NOERR;
  }
  else {
    header_local._4_4_ = CRCERR;
  }
  return header_local._4_4_;
}

Assistant:

Status
uncompress(Header *header, FILE *ifp, FILE *ofp, CompType type)
{
	/* BB changed next line. stackp points to huge pointers. */
	register char_type NSHUGE *stackp;
	register code_int finchar;
	register code_int code, oldcode, incode;
	char *message;

	init_garble();

#if !defined(BB_HUGE_STATIC_ARRAYS)
	if (!htab)
		htab = (count_int NSHUGE *) farcalloc(HSIZE, sizeof(count_int));
	if (!codetab)
		codetab =
			(unsigned short NSHUGE *) farcalloc(HSIZE,
											  sizeof(unsigned short));
	if (!htab || !codetab)
	{
		error("%s: uncompress: out of memory", ourname);
		exit(1);
	}
#endif							/* ! BB_HUGE_STATIC_ARRAYS */

	crc = 0;
	clear_flg = 0;
	offset = 0;
	size = 0;
	readsize = header->complen;

	if (type == SQUASH)
		maxbits = SQUASHBITS;
	else if (type == UNIX_COMPRESS)
	{
		/* Read the unix compress header */
		read_byte(ifp);
		read_byte(ifp);
		maxbits = read_byte(ifp) & 0x1f;
		readsize -= 3;
	}
	else
	{
		if (arcfs)
		{
			maxbits = arcfs_maxbits;
			ungarble('\0'); // Need to consume one byte of password.
		}
		else
		{
			maxbits = read_byte(ifp);
			readsize--;
		}
	}
	maxmaxcode = MAXCODE(maxbits);

	/*
	 * As above, initialize the first 256 entries in the table.
	 */
	maxcode = MAXCODE(n_bits = INIT_BITS);
	for (code = 255; code >= 0; code--)
	{
		tab_prefixof(code) = 0;
		tab_suffixof(code) = (char_type) code;
	}
	free_ent = FIRST;

	finchar = oldcode = getcode(ifp);
	if (oldcode == -1)			/* EOF already? */
		goto compress_exit;		/* Get out of here */

	/* first code must be 8 bits = char */
	if (type == CRUNCH)
	{
		putc_init();
		/* BB changed next line for Borland C/C++ 4 */
		putc_ncr(ofp, (Byte) finchar);
	}
	else
	{
		/* BB changed next three lines for Borland C/C++ 4 */
		if (!testing)
			write_byte(ofp, (Byte) finchar);
		calccrc((Byte) finchar);
	}

	stackp = de_stack;

	while ((code = getcode(ifp)) != -1)
	{
		if (check_stream(ifp) != FNOERR)
			break;
		if (code == CLEAR)
		{
			for (code = 255; code >= 0; code--)
				tab_prefixof(code) = 0;
			clear_flg = 1;
			free_ent = FIRST - 1;
			if ((code = getcode(ifp)) == -1)	/* O, untimely death! */
				break;
		}
		incode = code;
		/*
		 * Special case for KwKwK string.
		 */
		if (code >= free_ent)
		{
			/* BB changed next line for Borland C/C++ 4 */
			*stackp++ = (char_type) finchar;
			code = oldcode;
		}
		/*
		 * Generate output characters in reverse order
		 */

		while (code >= 256)
		{
			if ((char NSHUGE *)(stackp+1) > (char NSHUGE *)(&htab[0] + HSIZE))
			{
				error("%s: uncompress: corrupt or garbled archive file", ourname);
				exit(1);
			}
			*stackp++ = tab_suffixof(code);
			code = tab_prefixof(code);
		}
		if ((char NSHUGE *)(stackp+1) > (char NSHUGE *)(&htab[0] + HSIZE))
		{
			error("%s: uncompress: corrupt or garbled archive file", ourname);
			exit(1);
		}
		/* BB changed next line for Borland C/C++ 4 */
		/* *stackp++ = finchar = tab_suffixof(code); */
		finchar = tab_suffixof(code);
		*stackp++ = (char_type) finchar;

		/*
		 * And put them out in forward order
		 */
		while (stackp > de_stack)
		{
			stackp--;
			if (type == CRUNCH)
				putc_ncr(ofp, *stackp);
			else
			{
				if (!testing)
					write_byte(ofp, *stackp);
				calccrc(*stackp);
			}
		}

		/*
		 * Generate the new entry.
		 */
		if ((code = free_ent) < maxmaxcode)
		{
			/* BB changed next two lines for Borland C/C++ 4 */
			tab_prefixof(code) = (unsigned short) oldcode;
			tab_suffixof(code) = (char_type) finchar;
			free_ent = code + 1;
		}
		/*
		 * Remember previous code.
		 */
		oldcode = incode;
	}
  compress_exit:
	if (check_stream(ifp) == FRWERR)
		return (RERR);
	if (!testing && check_stream(ofp) == FRWERR)
		return (WERR);
	if ((Halfword) crc != header->crc)
		return (CRCERR);
	if (testing)
		switch (type)
		{
		case COMPRESS:
		case UNIX_COMPRESS:
			message = "OK (compressed)";
			break;
		case CRUNCH:
			message = "OK (crunched)";
			break;
		case SQUASH:
			message = "OK (squashed)";
			break;
		default:
			message = "internal error";
			break;
		}
	else
		switch (type)
		{
		case COMPRESS:
		case UNIX_COMPRESS:
			message = "uncompressed";
			break;
		case CRUNCH:
			message = "uncrunched";
			break;
		case SQUASH:
			message = "unsquashed";
			break;
		default:
			message = "internal error";
			break;
		}
	if (!quiet)
		msg("%s", message);
	return (NOERR);
}